

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xpath_string_length(lyxp_set **args,uint16_t arg_count,lyd_node *cur_node,lys_module *param_4,
                       lyxp_set *set,int options)

{
  float fVar1;
  lyxp_set *plVar2;
  lyd_node *plVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  lys_node *plVar7;
  uint uVar8;
  char *format;
  long lVar9;
  ly_ctx *ctx;
  
  if ((options & 0x1cU) == 0) {
    if (arg_count == 0) {
      iVar4 = lyxp_set_cast(set,LYXP_SET_STRING,cur_node,param_4,options);
      if (iVar4 != 0) {
        return -1;
      }
      sVar6 = strlen((set->val).str);
    }
    else {
      iVar4 = lyxp_set_cast(*args,LYXP_SET_STRING,cur_node,param_4,options);
      if (iVar4 != 0) {
        return -1;
      }
      sVar6 = strlen(((*args)->val).str);
    }
    fVar1 = *(float *)(&DAT_001b9e70 + (ulong)((long)sVar6 < 0) * 4);
    set_free_content(set);
    set->type = LYXP_SET_NUMBER;
    (set->val).num = (longdouble)(long)sVar6 + (longdouble)fVar1;
    iVar4 = 0;
  }
  else {
    if (arg_count == 0) {
      iVar4 = 0;
      if (set->type == LYXP_SET_SNODE_SET) {
        uVar8 = set->used;
        do {
          uVar8 = uVar8 - 1;
          if ((set->val).nodes[uVar8].pos == 1) {
            plVar3 = (set->val).nodes[uVar8].node;
            if (plVar3 != (lyd_node *)0x0) {
              if ((*(LYS_NODE *)&plVar3->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
                ctx = param_4->ctx;
                plVar7 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar3->ht);
                format = "Argument #0 of %s is a %s node \"%s\".";
                goto LAB_00180afc;
              }
              iVar5 = warn_is_string_type((lys_type *)&plVar3[1].ht);
              if (iVar5 == 0) {
                ctx = param_4->ctx;
                plVar7 = plVar3->schema;
                format = "Argument #0 of %s is node \"%s\", not of string-type.";
                goto LAB_00180afc;
              }
            }
            break;
          }
        } while (uVar8 != 0);
      }
    }
    else {
      plVar2 = *args;
      iVar5 = 0;
      iVar4 = 0;
      if (plVar2->type == LYXP_SET_SNODE_SET) {
        uVar8 = plVar2->used;
        do {
          uVar8 = uVar8 - 1;
          iVar4 = iVar5;
          if ((plVar2->val).nodes[uVar8].pos == 1) {
            plVar3 = (plVar2->val).nodes[uVar8].node;
            if (plVar3 != (lyd_node *)0x0) {
              if ((*(LYS_NODE *)&plVar3->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
                ctx = param_4->ctx;
                plVar7 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar3->ht);
                format = "Argument #1 of %s is a %s node \"%s\".";
                goto LAB_00180afc;
              }
              iVar5 = warn_is_string_type((lys_type *)&plVar3[1].ht);
              if (iVar5 == 0) {
                ctx = param_4->ctx;
                plVar7 = plVar3->schema;
                format = "Argument #1 of %s is node \"%s\", not of string-type.";
LAB_00180afc:
                ly_log(ctx,LY_LLWRN,LY_SUCCESS,format,"xpath_string_length",plVar7);
                iVar4 = 1;
              }
            }
            break;
          }
        } while (uVar8 != 0);
      }
    }
    uVar8 = set->used;
    if ((ulong)uVar8 != 0) {
      lVar9 = 0;
      do {
        if (*(int *)((long)&((set->val).nodes)->pos + lVar9) == 1) {
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar9) = 0;
        }
        lVar9 = lVar9 + 0x10;
      } while ((ulong)uVar8 << 4 != lVar9);
    }
  }
  return iVar4;
}

Assistant:

static int
xpath_string_length(struct lyxp_set **args, uint16_t arg_count, struct lyd_node *cur_node, struct lys_module *local_mod,
                    struct lyxp_set *set, int options)
{
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        if (!arg_count && (set->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(set))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #0 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #0 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (arg_count) {
        if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
            return -1;
        }
        set_fill_number(set, strlen(args[0]->val.str));
    } else {
        if (lyxp_set_cast(set, LYXP_SET_STRING, cur_node, local_mod, options)) {
            return -1;
        }
        set_fill_number(set, strlen(set->val.str));
    }

    return EXIT_SUCCESS;
}